

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableArraySizeSubCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourcePropFlags targetProp,bool sizedArray,bool extendedCases)

{
  TestNode *node;
  TestContext *pTVar1;
  int iVar2;
  undefined1 local_109;
  undefined1 local_e9;
  undefined1 local_c9;
  undefined1 local_a9;
  undefined1 local_89;
  TestCaseGroup *blockGroup;
  TestCaseGroup *aggregateGroup;
  ProgramResourceQueryTestTarget queryTarget;
  bool extendedCases_local;
  bool sizedArray_local;
  ProgramResourcePropFlags targetProp_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  queryTarget.interface._2_1_ = extendedCases;
  queryTarget.interface._3_1_ = sizedArray;
  queryTarget.propFlags = targetProp;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&aggregateGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,
             targetProp);
  if ((queryTarget.interface._2_1_ & 1) != PROGRAMINTERFACE_UNIFORM >> 0x10) {
    node = (TestNode *)operator_new(0x70);
    pTVar1 = Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,pTVar1,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
    iVar2 = 1;
    if ((queryTarget.interface._3_1_ & 1) != PROGRAMINTERFACE_UNIFORM >> 0x18) {
      iVar2 = 2;
    }
    generateVariableCases
              (context,parentStructure,(TestCaseGroup *)node,
               (ProgramResourceQueryTestTarget *)&aggregateGroup,iVar2,false);
  }
  blockGroup = targetGroup;
  if ((queryTarget.interface._2_1_ & 1) != PROGRAMINTERFACE_UNIFORM >> 0x10) {
    blockGroup = (TestCaseGroup *)operator_new(0x70);
    pTVar1 = Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup(blockGroup,pTVar1,"aggregates","Aggregate types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)blockGroup);
  }
  local_89 = PROGRAMINTERFACE_UNIFORM >> 0x18;
  if ((queryTarget.interface._2_1_ & 1) != PROGRAMINTERFACE_UNIFORM >> 0x10) {
    local_89 = queryTarget.interface._3_1_;
  }
  iVar2 = 1;
  if ((local_89 & 1) != PROGRAMINTERFACE_UNIFORM >> 0x18) {
    iVar2 = 2;
  }
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,blockGroup,(ProgramInterface)aggregateGroup,TYPE_FLOAT,iVar2,
             (bool)((queryTarget.interface._2_1_ ^ 0xff) & 1));
  local_a9 = PROGRAMINTERFACE_UNIFORM >> 0x18;
  if ((queryTarget.interface._2_1_ & 1) != PROGRAMINTERFACE_UNIFORM >> 0x10) {
    local_a9 = queryTarget.interface._3_1_;
  }
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,blockGroup,(ProgramInterface)aggregateGroup,TYPE_BOOL,
             (uint)((local_a9 & 1) != PROGRAMINTERFACE_UNIFORM >> 0x18),
             (bool)((queryTarget.interface._2_1_ ^ 0xff) & 1));
  local_c9 = PROGRAMINTERFACE_UNIFORM >> 0x18;
  if ((queryTarget.interface._2_1_ & 1) != PROGRAMINTERFACE_UNIFORM >> 0x10) {
    local_c9 = queryTarget.interface._3_1_;
  }
  iVar2 = 1;
  if ((local_c9 & 1) != PROGRAMINTERFACE_UNIFORM >> 0x18) {
    iVar2 = 2;
  }
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,blockGroup,(ProgramInterface)aggregateGroup,TYPE_BOOL_VEC3,
             iVar2,(bool)((queryTarget.interface._2_1_ ^ 0xff) & 1));
  local_e9 = PROGRAMINTERFACE_UNIFORM >> 0x18;
  if ((queryTarget.interface._2_1_ & 1) != PROGRAMINTERFACE_UNIFORM >> 0x10) {
    local_e9 = queryTarget.interface._3_1_;
  }
  iVar2 = 1;
  if ((local_e9 & 1) != PROGRAMINTERFACE_UNIFORM >> 0x18) {
    iVar2 = 2;
  }
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,blockGroup,(ProgramInterface)aggregateGroup,TYPE_FLOAT_VEC4,
             iVar2,(bool)((queryTarget.interface._2_1_ ^ 0xff) & 1));
  local_109 = PROGRAMINTERFACE_UNIFORM >> 0x18;
  if ((queryTarget.interface._2_1_ & 1) != PROGRAMINTERFACE_UNIFORM >> 0x10) {
    local_109 = queryTarget.interface._3_1_;
  }
  iVar2 = 1;
  if ((local_109 & 1) != PROGRAMINTERFACE_UNIFORM >> 0x18) {
    iVar2 = 2;
  }
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,blockGroup,(ProgramInterface)aggregateGroup,TYPE_INT_VEC2,iVar2
             ,(bool)((queryTarget.interface._2_1_ ^ 0xff) & 1));
  return;
}

Assistant:

static void generateBufferVariableArraySizeSubCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, ProgramResourcePropFlags targetProp, bool sizedArray, bool extendedCases)
{
	const ProgramResourceQueryTestTarget	queryTarget		(PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp);
	tcu::TestCaseGroup*						aggregateGroup;

	// .types
	if (extendedCases)
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
		targetGroup->addChild(blockGroup);

		generateVariableCases(context, parentStructure, blockGroup, queryTarget, (sizedArray) ? (2) : (1), false);
	}

	// .aggregates
	if (extendedCases)
	{
		aggregateGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
		targetGroup->addChild(aggregateGroup);
	}
	else
		aggregateGroup = targetGroup;

	// .float_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_FLOAT, (extendedCases && sizedArray) ? (2) : (1), !extendedCases);

	// .bool_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_BOOL, (extendedCases && sizedArray) ? (1) : (0), !extendedCases);

	// .bvec3_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_BOOL_VEC3, (extendedCases && sizedArray) ? (2) : (1), !extendedCases);

	// .vec4_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_FLOAT_VEC4, (extendedCases && sizedArray) ? (2) : (1), !extendedCases);

	// .ivec2_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_INT_VEC2, (extendedCases && sizedArray) ? (2) : (1), !extendedCases);
}